

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

ErrorOr<llvm::MD5::MD5Result> *
llvm::sys::fs::md5_contents(ErrorOr<llvm::MD5::MD5Result> *__return_storage_ptr__,Twine *Path)

{
  bool bVar1;
  error_code eVar2;
  undefined1 local_30 [8];
  error_code EC;
  int FD;
  Twine *Path_local;
  ErrorOr<llvm::MD5::MD5Result> *Result;
  
  eVar2 = openFileForRead(Path,(int *)((long)&EC._M_cat + 4),F_None,(SmallVectorImpl<char> *)0x0);
  EC._0_8_ = eVar2._M_cat;
  local_30._0_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_30);
  if (bVar1) {
    eVar2._4_4_ = 0;
    eVar2._M_value = local_30._0_4_;
    eVar2._M_cat = (error_category *)EC._0_8_;
    ErrorOr<llvm::MD5::MD5Result>::ErrorOr(__return_storage_ptr__,eVar2);
  }
  else {
    md5_contents(__return_storage_ptr__,EC._M_cat._4_4_);
    close(EC._M_cat._4_4_);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<MD5::MD5Result> md5_contents(const Twine &Path) {
  int FD;
  if (auto EC = openFileForRead(Path, FD, OF_None))
    return EC;

  auto Result = md5_contents(FD);
  close(FD);
  return Result;
}